

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

Iterator * __thiscall
leveldb::TableCache::NewIterator
          (TableCache *this,ReadOptions *options,uint64_t file_number,uint64_t file_size,
          Table **tableptr)

{
  bool bVar1;
  long lVar2;
  Table *in_RDI;
  undefined8 *in_R8;
  Iterator *result;
  Table *table;
  Status s;
  Handle *handle;
  uint64_t in_stack_00000060;
  TableCache *in_stack_00000068;
  ReadOptions *in_stack_ffffffffffffff98;
  void *arg1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  Status in_stack_ffffffffffffffc0;
  Iterator *local_8;
  
  if (in_R8 != (undefined8 *)0x0) {
    *in_R8 = 0;
  }
  FindTable(in_stack_00000068,in_stack_00000060,(uint64_t)this,(Handle **)options);
  bVar1 = Status::ok((Status *)&stack0xffffffffffffffc0);
  if (bVar1) {
    lVar2 = (*(code *)((in_RDI[6].rep_)->options).comparator[5]._vptr_Comparator)(in_RDI[6].rep_,0);
    arg1 = *(void **)(lVar2 + 8);
    local_8 = Table::NewIterator(in_RDI,in_stack_ffffffffffffff98);
    Iterator::RegisterCleanup
              ((Iterator *)in_stack_ffffffffffffffc0.state_,
               (CleanupFunction)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),arg1,
               local_8);
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = arg1;
    }
  }
  else {
    local_8 = NewErrorIterator((Status *)in_RDI);
  }
  Status::~Status((Status *)in_RDI);
  return local_8;
}

Assistant:

Iterator* TableCache::NewIterator(const ReadOptions& options,
                                  uint64_t file_number, uint64_t file_size,
                                  Table** tableptr) {
  if (tableptr != nullptr) {
    *tableptr = nullptr;
  }

  Cache::Handle* handle = nullptr;
  Status s = FindTable(file_number, file_size, &handle);
  if (!s.ok()) {
    return NewErrorIterator(s);
  }

  Table* table = reinterpret_cast<TableAndFile*>(cache_->Value(handle))->table;
  Iterator* result = table->NewIterator(options);
  result->RegisterCleanup(&UnrefEntry, cache_, handle);
  if (tableptr != nullptr) {
    *tableptr = table;
  }
  return result;
}